

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc7.c
# Opt level: O2

LispPTR N_OP_misc7(LispPTR arg1,LispPTR arg2,LispPTR arg3,LispPTR arg4,LispPTR arg5,LispPTR arg6,
                  LispPTR arg7,int alpha)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  ushort *puVar4;
  byte bVar5;
  ushort uVar6;
  LispPTR LVar7;
  LispPTR LVar8;
  DLword *pDVar9;
  LispPTR LVar10;
  uint uVar11;
  LispPTR LVar12;
  
  if (alpha == 1) {
    pDVar9 = Lisp_world + arg1;
    if ((arg2 & 0xfff0000) == 0xf0000) {
      LVar2 = arg2 | 0xffff0000;
    }
    else if ((arg2 & 0xfff0000) == 0xe0000) {
      LVar2 = arg2 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg2 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_00127805;
      pLVar3 = NativeAligned4FromLAddr(arg2);
      LVar2 = *pLVar3;
    }
    if ((arg3 & 0xfff0000) == 0xf0000) {
      LVar8 = arg3 | 0xffff0000;
    }
    else if ((arg3 & 0xfff0000) == 0xe0000) {
      LVar8 = arg3 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_00127805;
      pLVar3 = NativeAligned4FromLAddr(arg3);
      LVar8 = *pLVar3;
    }
    if ((arg4 & 0xfff0000) == 0xf0000) {
      LVar7 = arg4 | 0xffff0000;
    }
    else if ((arg4 & 0xfff0000) == 0xe0000) {
      LVar7 = arg4 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_00127805;
      pLVar3 = NativeAligned4FromLAddr(arg4);
      LVar7 = *pLVar3;
    }
    if ((arg5 & 0xfff0000) == 0xf0000) {
      LVar10 = arg5 | 0xffff0000;
    }
    else if ((arg5 & 0xfff0000) == 0xe0000) {
      LVar10 = arg5 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_00127805;
      pLVar3 = NativeAligned4FromLAddr(arg5);
      LVar10 = *pLVar3;
    }
    if ((arg6 & 0xfff0000) == 0xf0000) {
      LVar12 = arg6 | 0xffff0000;
    }
    else if ((arg6 & 0xfff0000) == 0xe0000) {
      LVar12 = arg6 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(arg6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
      goto LAB_00127805;
      pLVar3 = NativeAligned4FromLAddr(arg6);
      LVar12 = *pLVar3;
    }
    bVar5 = (byte)LVar2 & 0xf;
    uVar11 = 0x8000 >> bVar5;
    puVar4 = (ushort *)((ulong)(pDVar9 + (int)((int)LVar2 / 0x10 + (LVar10 - LVar8) * LVar12)) ^ 2);
    uVar1 = *puVar4;
    ScreenLocked = 1;
    if (LVar7 != 2) {
      if (LVar7 == 1) {
        uVar6 = (ushort)(-0x8001 >> bVar5) & uVar1;
      }
      else {
        uVar6 = (ushort)uVar11;
        if (LVar7 == 0) {
          uVar6 = uVar1 ^ uVar6;
        }
        else {
          uVar6 = uVar1 | uVar6;
        }
      }
      *puVar4 = uVar6;
    }
    if ((DisplayRegion68k <= pDVar9) && (pDVar9 <= DISP_MAX_Address)) {
      flush_display_ptrregion
                (pDVar9 + (int)((int)LVar2 / 0x10 + (LVar10 - LVar8) * LVar12),0,0x10,1);
    }
    ScreenLocked = 0;
    LVar2 = 0xe0001 - ((uVar11 & uVar1) == 0);
  }
  else {
LAB_00127805:
    MachineState.tosvalue = arg7;
    MachineState.errorexit = 1;
    LVar2 = 0xffffffff;
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_misc7(LispPTR arg1, LispPTR arg2, LispPTR arg3, LispPTR arg4, LispPTR arg5, LispPTR arg6, LispPTR arg7, int alpha)
{
  DLword *base;
  int x, y, operation, heightminus1, rasterwidth, oldbit;
  int offset;
  DLword bmdata;
  DLword bmmask;
#ifdef REALCURSOR
  int displayflg;
#endif

  DBPRINT(("MISC7 op with alpha byte %d.\n", alpha));

  if (alpha != 1) ERROR_EXIT(arg7);

  base = NativeAligned2FromLAddr(arg1);
  N_GETNUMBER(arg2, x, doufn);
  N_GETNUMBER(arg3, y, doufn);
  N_GETNUMBER(arg4, operation, doufn);
  N_GETNUMBER(arg5, heightminus1, doufn);
  N_GETNUMBER(arg6, rasterwidth, doufn);

  DBPRINT(("MISC7 args OK.\n"));

#ifdef REALCURSOR
  displayflg = n_new_cursorin(base, x, (heightminus1 - y), 1, 1);
  if (displayflg)
    HideCursor();
#endif

/* Bitmaps use a positive integer coordinate system with the lower left
   corner pixel at coordinate (0, 0). Storage is allocated in 16-bit words
   from the upper left corner (0, h-1), with rasterwidth 16-bit words per row.
*/
  offset = (rasterwidth * (heightminus1 - y)) + (x / BITSPER_DLWORD);
  bmmask = (1 << (BITSPER_DLWORD - 1)) >> (x & (BITSPER_DLWORD - 1));
  bmdata = GETWORDBASEWORD(base, offset);
  oldbit = bmdata & bmmask;

  ScreenLocked = T;

  switch (operation) {
  case OP_INVERT: GETWORDBASEWORD(base, offset) = bmdata ^ bmmask; break;
  case OP_ERASE: GETWORDBASEWORD(base, offset) = bmdata & ~bmmask; break;
  case OP_READ: break;
  default: GETWORDBASEWORD(base, offset) = bmdata | bmmask;
  }


#if defined(XWINDOW) || defined(SDL)
  if (in_display_segment(base)) {
    /* NB: base + offset doesn't need WORDPTR() wrapper */
    flush_display_ptrregion(base + offset, 0, 16, 1);
  }
#endif /* XWINDOW || SDL */

  ScreenLocked = NIL;
  DBPRINT(("FBITMAPBIT old bit = 0x%x.\n", oldbit));
  return (S_POSITIVE | (oldbit ? 1 : 0));

doufn:
  ERROR_EXIT(arg7);

}